

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeArmMOVTWInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint16_t *Decoder_00;
  uint64_t Address_00;
  uint uVar3;
  
  uVar3 = Insn >> 0xc & 0xf;
  uVar1 = MCInst_getOpcode(Inst);
  if (uVar1 == 0xd8) {
    Decoder_00 = GPRDecoderTable;
    uVar1 = (uint)GPRDecoderTable[uVar3];
    MCOperand_CreateReg0(Inst,uVar1);
  }
  else {
    Decoder_00 = GPRDecoderTable;
    uVar1 = (uint)GPRDecoderTable[uVar3];
  }
  MCOperand_CreateReg0(Inst,uVar1);
  MCOperand_CreateImm0(Inst,(ulong)(Insn >> 4 & 0xf000 | Insn & 0xfff));
  DVar2 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_00,Decoder_00);
  DVar2 = (*(code *)(&DAT_001c2e7c + *(int *)(&DAT_001c2e7c + (ulong)DVar2 * 4)))();
  return DVar2;
}

Assistant:

static DecodeStatus DecodeArmMOVTWInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned imm = 0;

	imm |= (fieldFromInstruction_4(Insn, 0, 12) << 0);
	imm |= (fieldFromInstruction_4(Insn, 16, 4) << 12);

	if (MCInst_getOpcode(Inst) == ARM_MOVTi16)
		if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, imm);

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}